

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LicenseReader.cpp
# Opt level: O2

bool __thiscall
license::LicenseReader::findFileWithEnvironmentVariable
          (LicenseReader *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *diskFiles,EventRegistry *eventRegistry)

{
  char *pcVar1;
  LicenseReader *pLVar2;
  bool bVar3;
  LicenseReader *pLVar4;
  iterator it;
  value_type *__x;
  allocator local_d1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  existing_pos;
  string local_b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  declared_positions;
  string local_68;
  string varName;
  
  pcVar1 = (this->licenseLocation).environmentVariableName;
  if ((pcVar1 == (char *)0x0) || (*pcVar1 == '\0')) {
    return false;
  }
  std::__cxx11::string::string((string *)&varName,pcVar1,(allocator *)&local_b8);
  if (varName._M_string_length == 0) {
    EventRegistry::addEvent(eventRegistry,ENVIRONMENT_VARIABLE_NOT_DEFINED,SVRT_WARN);
  }
  else {
    pLVar2 = (LicenseReader *)getenv(varName._M_dataplus._M_p);
    if ((pLVar2 != (LicenseReader *)0x0) && (*(char *)&pLVar2->_vptr_LicenseReader != '\0')) {
      pLVar4 = pLVar2;
      std::__cxx11::string::string((string *)&local_68,(char *)pLVar2,(allocator *)&local_b8);
      splitLicensePositions(&declared_positions,pLVar4,&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      pLVar4 = (LicenseReader *)&declared_positions;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_98,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)pLVar4);
      filterExistingFiles(&existing_pos,pLVar4,&local_98);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_98);
      bVar3 = existing_pos.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              existing_pos.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
      __x = existing_pos.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
      if (existing_pos.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          existing_pos.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        std::__cxx11::string::string((string *)&local_b8,(char *)pLVar2,&local_d1);
        EventRegistry::addEvent(eventRegistry,LICENSE_FILE_NOT_FOUND,SVRT_WARN,&local_b8);
        std::__cxx11::string::~string((string *)&local_b8);
      }
      else {
        for (; __x != existing_pos.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish; __x = __x + 1) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(diskFiles,__x);
          EventRegistry::addEvent(eventRegistry,LICENSE_FILE_FOUND,SVRT_INFO,__x);
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&existing_pos);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&declared_positions);
      goto LAB_00216140;
    }
    EventRegistry::addEvent(eventRegistry,ENVIRONMENT_VARIABLE_NOT_DEFINED,SVRT_WARN);
  }
  bVar3 = false;
LAB_00216140:
  std::__cxx11::string::~string((string *)&varName);
  return bVar3;
}

Assistant:

bool LicenseReader::findFileWithEnvironmentVariable(vector<string>& diskFiles,
		EventRegistry& eventRegistry) {
	bool licenseFileFoundWithEnvVariable = false;
	if (licenseLocation.environmentVariableName != NULL
			&& licenseLocation.environmentVariableName[0] != '\0') {
		string varName(licenseLocation.environmentVariableName);
		if (varName.length() > 0) {
			//var name is passed in by the calling application.
			char* env_var_value = getenv(varName.c_str());
			if (env_var_value != NULL && env_var_value[0] != '\0') {
				vector<string> declared_positions = splitLicensePositions(
						string(env_var_value));
				vector<string> existing_pos = filterExistingFiles(
						declared_positions);
				if (existing_pos.size() > 0) {
					licenseFileFoundWithEnvVariable = true;
					for (auto it = existing_pos.begin();
							it != existing_pos.end(); ++it) {
						diskFiles.push_back(*it);
						eventRegistry.addEvent(LICENSE_FILE_FOUND, SVRT_INFO,
								*it);
					}
				} else {
					eventRegistry.addEvent(LICENSE_FILE_NOT_FOUND, SVRT_WARN,
							env_var_value);
				}
			} else {
				eventRegistry.addEvent(ENVIRONMENT_VARIABLE_NOT_DEFINED,
						SVRT_WARN);
			}
		} else {
			eventRegistry.addEvent(ENVIRONMENT_VARIABLE_NOT_DEFINED, SVRT_WARN);
		}
	}
	return licenseFileFoundWithEnvVariable;
}